

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DivideTest.h
# Opt level: O3

void __thiscall
DivideTest<unsigned_long>::test_all_algorithms
          (DivideTest<unsigned_long> *this,unsigned_long denom,set_t<unsigned_long> *tested_denom)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  unsigned_long local_20;
  
  p_Var2 = (tested_denom->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var2 != (_Base_ptr)0x0) {
    p_Var1 = &(tested_denom->_M_t)._M_impl.super__Rb_tree_header;
    p_Var3 = &p_Var1->_M_header;
    do {
      if (*(ulong *)(p_Var2 + 1) >= denom) {
        p_Var3 = p_Var2;
      }
      p_Var2 = (&p_Var2->_M_left)[*(ulong *)(p_Var2 + 1) < denom];
    } while (p_Var2 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var3 != p_Var1) && (*(ulong *)(p_Var3 + 1) <= denom)) {
      return;
    }
  }
  local_20 = denom;
  test_many<(libdivide::Branching)0>(this,denom);
  test_many<(libdivide::Branching)1>(this,denom);
  std::
  _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
  ::_M_insert_unique<unsigned_long_const&>
            ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
              *)tested_denom,&local_20);
  return;
}

Assistant:

void test_all_algorithms(T denom, set_t<T> &tested_denom) {
#if !defined(__AVR__)
        if (tested_denom.end() == tested_denom.find(denom)) {
#endif
            PRINT_PROGRESS_MSG(F("Testing deom "));
            PRINT_PROGRESS_MSG(denom);
            PRINT_PROGRESS_MSG(F("\n"));
            test_many<BRANCHFULL>(denom);
            test_many<BRANCHFREE>(denom);
#if !defined(__AVR__)
            tested_denom.insert(denom);
        }
#else
        UNUSED(tested_denom);
#endif
    }